

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_21::ValidateSingleFeatureLifetimes
          (anon_unknown_21 *this,Edition edition,string_view full_name,FeatureSupport *support,
          ValidationResults *results)

{
  char *pcVar1;
  char *pcVar2;
  undefined4 in_register_00000034;
  size_t sVar3;
  Edition EVar4;
  Edition EVar5;
  StringifySink local_158;
  string local_138;
  AlphaNum local_118;
  AlphaNum local_e8;
  AlphaNum local_b8;
  AlphaNum local_88;
  AlphaNum local_58;
  
  sVar3 = CONCAT44(in_register_00000034,edition);
  pcVar1 = full_name._M_str;
  pcVar2 = (char *)full_name._M_len;
  EVar4 = (Edition)this;
  if (pcVar1 != _FieldOptions_FeatureSupport_default_instance_) {
    if ((int)EVar4 < *(int *)(pcVar1 + 0x20)) {
      local_b8.piece_ = absl::lts_20250127::NullSafeStringView("Feature ");
      local_e8.piece_._M_len = sVar3;
      local_e8.piece_._M_str = pcVar2;
      local_118.piece_ =
           absl::lts_20250127::NullSafeStringView(" wasn\'t introduced until edition ");
      local_158.buffer_._M_dataplus._M_p = (pointer)&local_158.buffer_.field_2;
      local_158.buffer_.field_2._M_allocated_capacity = 0;
      local_158.buffer_.field_2._8_8_ = 0;
      local_158.buffer_._M_string_length = 0;
      local_58.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_158,(Edition *)&stack0xfffffffffffffea4);
      local_88.piece_ = absl::lts_20250127::NullSafeStringView(" and can\'t be used in edition ");
      absl::lts_20250127::StrCat<google::protobuf::Edition>
                (&local_138,&local_b8,&local_e8,&local_118,&local_58,&local_88,
                 (Edition *)&stack0xfffffffffffffea0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)support,
                 &local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
    }
    if (((*(uint *)(pcVar1 + 0x10) & 8) == 0) || ((int)EVar4 < *(int *)(pcVar1 + 0x28))) {
      if ((*(uint *)(pcVar1 + 0x10) & 4) == 0) {
        return;
      }
      if ((int)EVar4 < *(int *)(pcVar1 + 0x24)) {
        return;
      }
      local_b8.piece_ = absl::lts_20250127::NullSafeStringView("Feature ");
      local_e8.piece_._M_len = sVar3;
      local_e8.piece_._M_str = pcVar2;
      local_118.piece_ = absl::lts_20250127::NullSafeStringView(" has been deprecated in edition ");
      EVar5 = *(Edition *)(pcVar1 + 0x24);
      local_158.buffer_._M_dataplus._M_p = (pointer)&local_158.buffer_.field_2;
      local_158.buffer_.field_2._M_allocated_capacity = 0;
      local_158.buffer_.field_2._8_8_ = 0;
      local_158.buffer_._M_string_length = 0;
      local_58.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_158,(Edition *)&stack0xfffffffffffffea4);
      local_88.piece_ = absl::lts_20250127::NullSafeStringView(": ");
      absl::lts_20250127::StrCat<std::__cxx11::string>
                (&local_138,(lts_20250127 *)&local_b8,&local_e8,&local_118,&local_58,&local_88,
                 (AlphaNum *)(*(ulong *)(pcVar1 + 0x18) & 0xfffffffffffffffc),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(EVar5,EVar4));
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &(support->field_0)._impl_.deprecation_warning_,&local_138);
    }
    else {
      local_b8.piece_ = absl::lts_20250127::NullSafeStringView("Feature ");
      local_e8.piece_._M_len = sVar3;
      local_e8.piece_._M_str = pcVar2;
      local_118.piece_ = absl::lts_20250127::NullSafeStringView(" has been removed in edition ");
      local_158.buffer_._M_dataplus._M_p = (pointer)&local_158.buffer_.field_2;
      local_158.buffer_.field_2._M_allocated_capacity = 0;
      local_158.buffer_.field_2._8_8_ = 0;
      local_158.buffer_._M_string_length = 0;
      local_58.piece_ =
           absl::lts_20250127::strings_internal::ExtractStringification<google::protobuf::Edition>
                     (&local_158,(Edition *)&stack0xfffffffffffffea4);
      local_88.piece_ = absl::lts_20250127::NullSafeStringView(" and can\'t be used in edition ");
      absl::lts_20250127::StrCat<google::protobuf::Edition>
                (&local_138,&local_b8,&local_e8,&local_118,&local_58,&local_88,
                 (Edition *)&stack0xfffffffffffffea0);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)support,
                 &local_138);
    }
    std::__cxx11::string::~string((string *)&local_138);
    std::__cxx11::string::~string((string *)&local_158);
  }
  return;
}

Assistant:

void ValidateSingleFeatureLifetimes(
    Edition edition, absl::string_view full_name,
    const FieldOptions::FeatureSupport& support,
    FeatureResolver::ValidationResults& results) {
  // Skip fields that don't have feature support specified.
  if (&support == &FieldOptions::FeatureSupport::default_instance()) return;

  if (edition < support.edition_introduced()) {
    results.errors.emplace_back(
        absl::StrCat("Feature ", full_name, " wasn't introduced until edition ",
                     support.edition_introduced(),
                     " and can't be used in edition ", edition));
  }
  if (support.has_edition_removed() && edition >= support.edition_removed()) {
    results.errors.emplace_back(absl::StrCat(
        "Feature ", full_name, " has been removed in edition ",
        support.edition_removed(), " and can't be used in edition ", edition));
  } else if (support.has_edition_deprecated() &&
             edition >= support.edition_deprecated()) {
    results.warnings.emplace_back(absl::StrCat(
        "Feature ", full_name, " has been deprecated in edition ",
        support.edition_deprecated(), ": ", support.deprecation_warning()));
  }
}